

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::LogicalType::LogicalType(LogicalType *this,void **vtt,LogicalType *other52)

{
  void *pvVar1;
  int32_t iVar2;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x30)) = vtt[1];
  this->STRING = (StringType)&PTR__StringType_017b4b60;
  this->MAP = (MapType)&PTR__MapType_017b4c30;
  this->LIST = (ListType)&PTR__ListType_017b4c98;
  this->ENUM = (EnumType)&PTR__EnumType_017b4d00;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_017b4ea0;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_017b4d68;
  TimeType::TimeType(&this->TIME);
  TimestampType::TimestampType(&this->TIMESTAMP);
  *(undefined ***)&this->INTEGER = &PTR__IntType_017b5178;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_017b4e38;
  this->JSON = (JsonType)&PTR__JsonType_017b51e0;
  this->BSON = (BsonType)&PTR__BsonType_017b5248;
  this->UUID = (UUIDType)&PTR__UUIDType_017b4bc8;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_017b4dd0;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  iVar2 = (other52->DECIMAL).precision;
  (this->DECIMAL).scale = (other52->DECIMAL).scale;
  (this->DECIMAL).precision = iVar2;
  (this->TIME).isAdjustedToUTC = (other52->TIME).isAdjustedToUTC;
  (this->TIME).unit.__isset = (other52->TIME).unit.__isset;
  (this->TIMESTAMP).isAdjustedToUTC = (other52->TIMESTAMP).isAdjustedToUTC;
  (this->TIMESTAMP).unit.__isset = (other52->TIMESTAMP).unit.__isset;
  (this->INTEGER).bitWidth = (other52->INTEGER).bitWidth;
  (this->INTEGER).isSigned = (other52->INTEGER).isSigned;
  this->__isset = other52->__isset;
  return;
}

Assistant:

LogicalType::LogicalType(const LogicalType& other52) noexcept {
  STRING = other52.STRING;
  MAP = other52.MAP;
  LIST = other52.LIST;
  ENUM = other52.ENUM;
  DECIMAL = other52.DECIMAL;
  DATE = other52.DATE;
  TIME = other52.TIME;
  TIMESTAMP = other52.TIMESTAMP;
  INTEGER = other52.INTEGER;
  UNKNOWN = other52.UNKNOWN;
  JSON = other52.JSON;
  BSON = other52.BSON;
  UUID = other52.UUID;
  FLOAT16 = other52.FLOAT16;
  __isset = other52.__isset;
}